

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O3

void lgx_rb_del(lgx_rb_t *rbt,lgx_rb_node_t *node)

{
  lgx_rb_node_t *plVar1;
  lgx_rb_node_t *plVar2;
  lgx_rb_node_t *plVar3;
  ulong uVar4;
  lgx_rb_node_t *__ptr;
  lgx_rb_node_t *plVar5;
  lgx_rb_node_s *plVar6;
  ulong *puVar7;
  long *plVar8;
  lgx_rb_node_s *plVar9;
  uint uVar10;
  uintptr_t uVar11;
  undefined8 *puVar12;
  lgx_rb_node_s *plVar13;
  
  plVar3 = node->left;
  plVar2 = node->right;
  plVar1 = plVar2;
  __ptr = node;
  if (plVar3 == (lgx_rb_node_t *)0x0) {
LAB_00111a21:
    plVar5 = (lgx_rb_node_t *)(__ptr->parent_color & 0xfffffffffffffffc);
    if (plVar1 == (lgx_rb_node_t *)0x0) {
      plVar1 = (lgx_rb_node_t *)0x0;
    }
    else {
LAB_00111a41:
      plVar1->parent_color = (ulong)((uint)plVar1->parent_color & 3) | (ulong)plVar5;
    }
    plVar3 = rbt->root;
    if (plVar3 == node) {
      rbt->root = plVar1;
      plVar3 = plVar1;
    }
    else {
      puVar7 = (ulong *)(node->parent_color & 0xfffffffffffffffc);
      if ((lgx_rb_node_t *)*puVar7 == node) {
        *puVar7 = (ulong)plVar1;
      }
      else {
        puVar7[1] = (ulong)plVar1;
      }
    }
  }
  else {
    plVar6 = plVar2;
    if (plVar2 == (lgx_rb_node_t *)0x0) {
      plVar5 = (lgx_rb_node_t *)(node->parent_color & 0xfffffffffffffffc);
      plVar1 = plVar3;
      goto LAB_00111a41;
    }
    do {
      __ptr = plVar6;
      plVar6 = __ptr->left;
    } while (__ptr->left != (lgx_rb_node_s *)0x0);
    plVar1 = __ptr->right;
    if (__ptr == node) goto LAB_00111a21;
    plVar3->parent_color = (ulong)((uint)plVar3->parent_color & 3) | (ulong)__ptr;
    __ptr->left = plVar3;
    plVar5 = __ptr;
    if (__ptr != plVar2) {
      plVar5 = (lgx_rb_node_t *)(__ptr->parent_color & 0xfffffffffffffffc);
      plVar3 = plVar5;
      if (plVar1 != (lgx_rb_node_t *)0x0) {
        plVar1->parent_color = (ulong)((uint)plVar1->parent_color & 3) | (ulong)plVar5;
        plVar3 = (lgx_rb_node_t *)(__ptr->parent_color & 0xfffffffffffffffc);
      }
      plVar3->left = plVar1;
      __ptr->right = plVar2;
      node->right->parent_color = (ulong)((uint)node->right->parent_color & 3) | (ulong)__ptr;
    }
    plVar3 = rbt->root;
    if (plVar3 == node) {
      rbt->root = __ptr;
      puVar7 = (ulong *)(node->parent_color & 0xfffffffffffffffc);
      plVar3 = __ptr;
    }
    else {
      puVar7 = (ulong *)(node->parent_color & 0xfffffffffffffffc);
      if ((lgx_rb_node_t *)*puVar7 == node) {
        *puVar7 = (ulong)__ptr;
      }
      else {
        puVar7[1] = (ulong)__ptr;
      }
    }
    uVar10 = (uint)__ptr->parent_color;
    uVar4 = (ulong)(uVar10 & 3);
    __ptr->parent_color = uVar4 | (ulong)puVar7;
    __ptr->parent_color =
         uVar4 & 0xfffffffffffffffe | (ulong)puVar7 | (ulong)((uint)node->parent_color & 1);
    node->parent_color = node->parent_color & 0xfffffffffffffffe | (ulong)(uVar10 & 1);
    __ptr = node;
  }
  if ((__ptr->parent_color & 1) != 0) {
    if (plVar1 == plVar3) {
LAB_00111f41:
      plVar2 = plVar1;
      if (plVar1 == (lgx_rb_node_t *)0x0) goto LAB_00111f55;
    }
    else {
      do {
        plVar2 = plVar5;
        if ((plVar1 != (lgx_rb_node_t *)0x0) && (uVar4 = plVar1->parent_color, (uVar4 & 1) == 0))
        goto LAB_00111f4d;
        plVar5 = plVar2->left;
        if (plVar1 == plVar5) {
          plVar9 = plVar2->right;
          plVar6 = plVar9;
          if ((plVar9->parent_color & 1) == 0) {
            plVar9->parent_color = plVar9->parent_color | 1;
            uVar11 = plVar2->parent_color & 0xfffffffffffffffe;
            plVar2->parent_color = uVar11;
            plVar6 = plVar9->left;
            plVar2->right = plVar6;
            if (plVar6 != (lgx_rb_node_s *)0x0) {
              plVar6->parent_color = (ulong)((uint)plVar6->parent_color & 3) | (ulong)plVar2;
              uVar11 = plVar2->parent_color;
            }
            plVar9->parent_color =
                 (ulong)((uint)plVar9->parent_color & 3) | uVar11 & 0xfffffffffffffffc;
            if (plVar3 == plVar2) {
              rbt->root = plVar9;
              uVar4 = plVar2->parent_color;
              plVar3 = plVar9;
            }
            else {
              uVar4 = plVar2->parent_color;
              puVar7 = (ulong *)(uVar4 & 0xfffffffffffffffc);
              if ((lgx_rb_node_t *)*puVar7 == plVar2) {
                *puVar7 = (ulong)plVar9;
              }
              else {
                puVar7[1] = (ulong)plVar9;
                plVar6 = plVar2->right;
              }
            }
            plVar9->left = plVar2;
            plVar2->parent_color = (ulong)((uint)uVar4 & 3) | (ulong)plVar9;
          }
          plVar9 = plVar6->left;
          if ((plVar9 == (lgx_rb_node_s *)0x0) || ((plVar9->parent_color & 1) != 0)) {
            plVar13 = plVar6->right;
            if ((plVar13 == (lgx_rb_node_s *)0x0) || ((plVar13->parent_color & 1) != 0))
            goto LAB_00111cb3;
LAB_00111d62:
            if ((plVar13->parent_color & 1) != 0) {
              if (plVar9 != (lgx_rb_node_s *)0x0) goto LAB_00111d72;
              goto LAB_00111d76;
            }
          }
          else {
            plVar13 = plVar6->right;
            if (plVar13 != (lgx_rb_node_s *)0x0) goto LAB_00111d62;
LAB_00111d72:
            *(byte *)&plVar9->parent_color = (byte)plVar9->parent_color | 1;
LAB_00111d76:
            uVar11 = plVar6->parent_color & 0xfffffffffffffffe;
            plVar6->parent_color = uVar11;
            plVar13 = plVar9->right;
            plVar6->left = plVar13;
            if (plVar13 != (lgx_rb_node_s *)0x0) {
              plVar13->parent_color = (ulong)((uint)plVar13->parent_color & 3) | (ulong)plVar6;
              uVar11 = plVar6->parent_color;
            }
            plVar9->parent_color =
                 (ulong)((uint)plVar9->parent_color & 3) | uVar11 & 0xfffffffffffffffc;
            if (plVar3 == plVar6) {
              rbt->root = plVar9;
              uVar4 = plVar6->parent_color;
              plVar3 = plVar9;
            }
            else {
              uVar4 = plVar6->parent_color;
              puVar7 = (ulong *)(uVar4 & 0xfffffffffffffffc);
              if ((lgx_rb_node_s *)puVar7[1] == plVar6) {
                puVar7[1] = (ulong)plVar9;
              }
              else {
                *puVar7 = (ulong)plVar9;
              }
            }
            plVar9->right = plVar6;
            plVar6->parent_color = (ulong)((uint)uVar4 & 3) | (ulong)plVar9;
            plVar6 = plVar2->right;
            plVar13 = plVar6->right;
          }
          plVar6->parent_color =
               plVar6->parent_color & 0xfffffffffffffffe | (ulong)((uint)plVar2->parent_color & 1);
          *(byte *)&plVar2->parent_color = (byte)plVar2->parent_color | 1;
          if (plVar13 != (lgx_rb_node_s *)0x0) {
            *(byte *)&plVar13->parent_color = (byte)plVar13->parent_color | 1;
          }
          plVar9 = plVar6->left;
          plVar2->right = plVar9;
          if (plVar9 != (lgx_rb_node_s *)0x0) {
            plVar9->parent_color = (ulong)((uint)plVar9->parent_color & 3) | (ulong)plVar2;
          }
          plVar6->parent_color =
               (ulong)((uint)plVar6->parent_color & 3) | plVar2->parent_color & 0xfffffffffffffffc;
          plVar9 = plVar6;
          if (plVar3 == plVar2) {
            rbt->root = plVar6;
            uVar4 = plVar2->parent_color;
          }
          else {
            uVar4 = plVar2->parent_color;
            plVar8 = (long *)(uVar4 & 0xfffffffffffffffc);
            if ((lgx_rb_node_t *)*plVar8 == plVar2) {
              *plVar8 = (long)plVar6;
            }
            else {
              plVar8[1] = (long)plVar6;
            }
          }
LAB_00111f31:
          plVar6->left = plVar2;
          plVar2->parent_color = (ulong)((uint)uVar4 & 3) | (ulong)plVar9;
          goto LAB_00111f41;
        }
        plVar6 = plVar5;
        if ((plVar5->parent_color & 1) == 0) {
          plVar5->parent_color = plVar5->parent_color | 1;
          uVar11 = plVar2->parent_color & 0xfffffffffffffffe;
          plVar2->parent_color = uVar11;
          plVar6 = plVar5->right;
          plVar2->left = plVar6;
          if (plVar6 != (lgx_rb_node_s *)0x0) {
            plVar6->parent_color = (ulong)((uint)plVar6->parent_color & 3) | (ulong)plVar2;
            uVar11 = plVar2->parent_color;
          }
          plVar5->parent_color =
               (ulong)((uint)plVar5->parent_color & 3) | uVar11 & 0xfffffffffffffffc;
          if (plVar3 == plVar2) {
            rbt->root = plVar5;
            uVar4 = plVar2->parent_color;
            plVar3 = plVar5;
          }
          else {
            uVar4 = plVar2->parent_color;
            puVar7 = (ulong *)(uVar4 & 0xfffffffffffffffc);
            if ((lgx_rb_node_t *)puVar7[1] == plVar2) {
              puVar7[1] = (ulong)plVar5;
            }
            else {
              *puVar7 = (ulong)plVar5;
              plVar6 = plVar2->left;
            }
          }
          plVar5->right = plVar2;
          plVar2->parent_color = (ulong)((uint)uVar4 & 3) | (ulong)plVar5;
        }
        plVar5 = plVar6->right;
        if ((plVar5 != (lgx_rb_node_t *)0x0) && ((plVar5->parent_color & 1) == 0)) {
          plVar13 = plVar6->left;
          if (plVar13 != (lgx_rb_node_s *)0x0) goto LAB_00111cdd;
LAB_00111cf1:
          *(byte *)&plVar5->parent_color = (byte)plVar5->parent_color | 1;
LAB_00111cf5:
          uVar11 = plVar6->parent_color & 0xfffffffffffffffe;
          plVar6->parent_color = uVar11;
          plVar9 = plVar5->left;
          plVar6->right = plVar9;
          if (plVar9 != (lgx_rb_node_s *)0x0) {
            plVar9->parent_color = (ulong)((uint)plVar9->parent_color & 3) | (ulong)plVar6;
            uVar11 = plVar6->parent_color;
          }
          plVar5->parent_color =
               (ulong)((uint)plVar5->parent_color & 3) | uVar11 & 0xfffffffffffffffc;
          if (plVar3 == plVar6) {
            rbt->root = plVar5;
            uVar4 = plVar6->parent_color;
            plVar3 = plVar5;
          }
          else {
            uVar4 = plVar6->parent_color;
            puVar7 = (ulong *)(uVar4 & 0xfffffffffffffffc);
            if ((lgx_rb_node_s *)*puVar7 == plVar6) {
              *puVar7 = (ulong)plVar5;
            }
            else {
              puVar7[1] = (ulong)plVar5;
            }
          }
          plVar5->left = plVar6;
          plVar6->parent_color = (ulong)((uint)uVar4 & 3) | (ulong)plVar5;
          plVar13 = plVar2->left->left;
          plVar9 = plVar2->left;
LAB_00111dfd:
          plVar9->parent_color =
               plVar9->parent_color & 0xfffffffffffffffe | (ulong)((uint)plVar2->parent_color & 1);
          *(byte *)&plVar2->parent_color = (byte)plVar2->parent_color | 1;
          if (plVar13 != (lgx_rb_node_s *)0x0) {
            *(byte *)&plVar13->parent_color = (byte)plVar13->parent_color | 1;
          }
          plVar6 = plVar9->right;
          plVar2->left = plVar6;
          if (plVar6 != (lgx_rb_node_s *)0x0) {
            plVar6->parent_color = (ulong)((uint)plVar6->parent_color & 3) | (ulong)plVar2;
          }
          plVar6 = (lgx_rb_node_s *)&plVar9->right;
          plVar9->parent_color =
               (ulong)((uint)plVar9->parent_color & 3) | plVar2->parent_color & 0xfffffffffffffffc;
          if (plVar3 == plVar2) {
            rbt->root = plVar9;
            uVar4 = plVar2->parent_color;
          }
          else {
            uVar4 = plVar2->parent_color;
            puVar12 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
            if ((lgx_rb_node_t *)puVar12[1] == plVar2) {
              puVar12[1] = plVar9;
            }
            else {
              *puVar12 = plVar9;
            }
          }
          goto LAB_00111f31;
        }
        plVar13 = plVar6->left;
        if ((plVar13 != (lgx_rb_node_s *)0x0) && ((plVar13->parent_color & 1) == 0)) {
LAB_00111cdd:
          plVar9 = plVar6;
          if ((plVar13->parent_color & 1) != 0) {
            if (plVar5 != (lgx_rb_node_t *)0x0) goto LAB_00111cf1;
            goto LAB_00111cf5;
          }
          goto LAB_00111dfd;
        }
LAB_00111cb3:
        *(byte *)&plVar6->parent_color = (byte)plVar6->parent_color & 0xfe;
        plVar1 = plVar2;
        plVar5 = (lgx_rb_node_t *)(plVar2->parent_color & 0xfffffffffffffffc);
      } while (plVar2 != plVar3);
    }
    uVar4 = plVar2->parent_color;
    plVar1 = plVar2;
LAB_00111f4d:
    plVar1->parent_color = uVar4 | 1;
  }
LAB_00111f55:
  lgx_str_cleanup(&__ptr->key);
  free(__ptr);
  rbt->size = rbt->size - 1;
  return;
}

Assistant:

void lgx_rb_del(lgx_rb_t * rbt, lgx_rb_node_t * node) {
    lgx_rb_node_t * y = node; // 将要被删除的结点 
    lgx_rb_node_t * x = NULL; // y 的唯一子节点
    lgx_rb_node_t * x_parent = NULL;

    // 这里我们确定了要删除的节点 y，并确定了其唯一字节点 x，注意 x 可能为 NULL
    if (y->left == 0) {             // node has at most one non-null child. y == node.  
        x = y->right;               // x might be null.  
    } else {  
        if (y->right == 0) {        // node has exactly one non-null child.  y == node.  
            x = y->left;            // x is not null.  
        } else {                    // node has two non-null children.  Set y to  
            y = y->right;           //   node's successor.  x might be null.  
            while (y->left != 0) {
                y = y->left;
            }
            x = y->right;
        }
    }

    if (y != node) {                 // relink y in place of z.  y is z's successor  
        // 移动 node 的左子节点，使其成为 y 的左子节点
        rb_set_parent(node->left, y);
        y->left = node->left;

        if (y != node->right) {
            x_parent = rb_parent(y);
            if (x) {
                rb_set_parent(x, rb_parent(y));
            }
            rb_parent(y)->left = x;      // y must be a left child

            y->right = node->right;
            rb_set_parent(node->right, y);
        } else {
            x_parent = y;
        }

        if (rbt->root == node) {
            rbt->root = y;
        } else if (rb_parent(node)->left == node) {
            rb_parent(node)->left = y;
        } else {
            rb_parent(node)->right = y;
        }
        rb_set_parent(y, rb_parent(node));

        // 交换 y 与 node 的颜色
        lgx_rb_color_t tmp = rb_color(y);
        rb_set_color(y, rb_color(node));
        rb_set_color(node, tmp);

        y = node;  
        // y now points to node to be actually deleted  
    } else {                        // y == node
        x_parent = rb_parent(y);  
        if (x) {
            rb_set_parent(x, rb_parent(y));
        }
        if (rbt->root == node) {
            rbt->root = x;  
        } else {
            if (rb_parent(node)->left == node) {
                rb_parent(node)->left = x;  
            } else {
                rb_parent(node)->right = x;
            }
        }
    }

    // 删除黑色结点后，导致黑色缺失，违背性质4,故对树进行调整 
    if( rb_is_black(y) ) {
        while (x != rbt->root && (!x || rb_is_black(x))) {
            if (x == x_parent->left) {
                lgx_rb_node_t* uncle = x_parent->right;
                if(rb_is_red(uncle)) {
                    rb_set_black(uncle);
                    rb_set_red(x_parent);
                    rb_rotate_left(rbt, x_parent);  
                    uncle = x_parent->right;  
                }  
                if ((!uncle->left  || rb_is_black(uncle->left)) &&
                    (!uncle->right || rb_is_black(uncle->right))) {
                    rb_set_red(uncle);
                    x = x_parent;
                    x_parent = rb_parent(x_parent);
                } else {  
                    if (!uncle->right || rb_is_black(uncle->right)) {  
                        if (uncle->left) {
                            rb_set_black(uncle->left);
                        }
                        rb_set_red(uncle);
                        rb_rotate_right(rbt, uncle);
                        uncle = x_parent->right;
                    }
                    rb_set_color(uncle, rb_color(x_parent));
                    rb_set_black(x_parent);
                    if (uncle->right) {
                        rb_set_black(uncle->right);
                    }
                    rb_rotate_left(rbt, x_parent);  
                    break;
                }
            } else {                  // same as above, with right <-> left.  
                lgx_rb_node_t* uncle = x_parent->left;
                if (rb_is_red(uncle)) {
                    rb_set_black(uncle);
                    rb_set_red(x_parent);
                    rb_rotate_right(rbt, x_parent);  
                    uncle = x_parent->left;  
                }
                if ((!uncle->right || rb_is_black(uncle->right)) &&  
                    (!uncle->left  || rb_is_black(uncle->left))) {  
                    rb_set_red(uncle);
                    x = x_parent;  
                    x_parent = rb_parent(x_parent);
                } else {  
                    if (!uncle->left || rb_is_black(uncle->left)) {  
                        if (uncle->right) {
                            rb_set_black(uncle->right);
                        }
                        rb_set_red(uncle);
                        rb_rotate_left(rbt, uncle);  
                        uncle = x_parent->left;  
                    }  
                    rb_set_color(uncle, rb_color(x_parent));
                    rb_set_black(x_parent);
                    if (uncle->left) {
                        rb_set_black(uncle->left);
                    }
                    rb_rotate_right(rbt, x_parent);  
                    break;  
                }  
            }
        }
        if (x) {
            rb_set_black(x);
        }
    }

    /* 删除 y */
    lgx_str_cleanup(&y->key);
    xfree(y);

    rbt->size --;
    
    //lgx_rbtree_print(rbt->root);
    //lgx_log_debug("rbtree delete\n");
}